

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O2

bool __thiscall glslang::TArraySizes::clearInnerUnsized(TArraySizes *this)

{
  TVector<glslang::TArraySize> *pTVar1;
  int iVar2;
  uint uVar3;
  int d;
  int i;
  
  i = 1;
  while( true ) {
    pTVar1 = (this->sizes).sizes;
    if (pTVar1 == (TVector<glslang::TArraySize> *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (int)((ulong)((long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar2 <= i) break;
    uVar3 = TSmallArrayVector::getDimSize(&this->sizes,i);
    if (uVar3 == 0) {
      TSmallArrayVector::setDimSize(&this->sizes,i,1);
    }
    i = i + 1;
  }
  return false;
}

Assistant:

bool clearInnerUnsized()
    {
        for (int d = 1; d < sizes.size(); ++d) {
            if (sizes.getDimSize(d) == (unsigned)UnsizedArraySize)
                setDimSize(d, 1);
        }

        return false;
    }